

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.hh
# Opt level: O0

size_t OpenMesh::IO::restore<OpenMesh::IO::OMFormat::Chunk::PropertyName>
                 (istream *_is,PropertyName *_pn,bool _swap)

{
  bool bVar1;
  allocator local_149;
  string local_148 [32];
  char local_128 [8];
  char buf [256];
  size_t size;
  bool _swap_local;
  PropertyName *_pn_local;
  istream *_is_local;
  
  restore<unsigned_long>(_is,(unsigned_long *)(buf + 0xf8),Integer_8,_swap);
  bVar1 = OMFormat::Chunk::PropertyName::is_valid(buf._248_8_);
  if (!bVar1) {
    __assert_fail("OMFormat::Chunk::PropertyName::is_valid( size )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/IO/OMFormat.hh"
                  ,0x2c7,
                  "size_t OpenMesh::IO::restore(std::istream &, OMFormat::Chunk::PropertyName &, bool)"
                 );
  }
  if (buf._248_8_ != 0) {
    std::istream::read((char *)_is,(long)local_128);
    local_128[buf._248_8_] = '\0';
    std::__cxx11::string::resize((ulong)_pn);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,local_128,&local_149);
    OMFormat::Chunk::PropertyName::operator=(_pn,(string *)local_148);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  return buf._248_8_ + 1;
}

Assistant:

inline
  size_t restore( std::istream& _is, OMFormat::Chunk::PropertyName& _pn,
		  bool _swap )
  {
    size_t size;

    restore( _is, size, OMFormat::Chunk::Integer_8, _swap); // 1 byte

    assert( OMFormat::Chunk::PropertyName::is_valid( size ) );

    if ( size > 0 )
    {
      char buf[256];
      _is.read( buf, size ); // size bytes
      buf[size] = '\0';
      _pn.resize(size);
      _pn = buf;
    }
    return size+1;
  }